

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

Table * __thiscall wabt::Module::GetTable(Module *this,Var *var)

{
  pointer ppTVar1;
  Index IVar2;
  Table *pTVar3;
  
  IVar2 = BindingHash::FindIndex(&this->table_bindings,var);
  ppTVar1 = (this->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((ulong)IVar2 <
      (ulong)((long)(this->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3)) {
    pTVar3 = ppTVar1[IVar2];
  }
  else {
    pTVar3 = (Table *)0x0;
  }
  return pTVar3;
}

Assistant:

const Table* Module::GetTable(const Var& var) const {
  return const_cast<Module*>(this)->GetTable(var);
}